

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall CServer::SendMsg(CServer *this,CMsgPacker *pMsg,int Flags,int ClientID)

{
  long lVar1;
  int in_ECX;
  uint in_EDX;
  CPacker *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  CNetChunk Packet;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar2;
  undefined4 uVar3;
  int local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == (CPacker *)0x0) {
    local_3c = -1;
  }
  else if ((in_ECX == -1) ||
          ((((-1 < in_ECX && (in_ECX < 0x40)) &&
            (*(int *)(in_RDI + 0x38 + (long)in_ECX * 0x195f0) != 0)) &&
           ((*(byte *)(in_RDI + (long)in_ECX * 0x195f0 + 0x19615) & 1) == 0)))) {
    mem_zero((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c);
    CPacker::Data(in_RSI);
    CPacker::Size(in_RSI);
    if ((in_EDX & 4) == 0) {
      CPacker::Data(in_RSI);
      CPacker::Size(in_RSI);
      CDemoRecorder::RecordMessage
                ((CDemoRecorder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
    }
    if ((in_EDX & 0x10) == 0) {
      if (in_ECX == -1) {
        uVar3 = 0xffffffff;
        for (iVar2 = 0; iVar2 < 0x40; iVar2 = iVar2 + 1) {
          if ((*(int *)(in_RDI + 0x38 + (long)iVar2 * 0x195f0) == 5) &&
             ((*(byte *)(in_RDI + (long)iVar2 * 0x195f0 + 0x19615) & 1) == 0)) {
            CNetServer::Send((CNetServer *)CONCAT44(in_EDX,uVar3),
                             (CNetChunk *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                             (TOKEN)((ulong)in_RDI >> 0x20));
          }
        }
      }
      else {
        CNetServer::Send((CNetServer *)CONCAT44(in_EDX,in_ECX),
                         (CNetChunk *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (TOKEN)((ulong)in_RDI >> 0x20));
      }
    }
    local_3c = 0;
  }
  else {
    local_3c = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_3c;
  }
  __stack_chk_fail();
}

Assistant:

int CServer::SendMsg(CMsgPacker *pMsg, int Flags, int ClientID)
{
	CNetChunk Packet;
	if(!pMsg)
		return -1;

	// drop invalid packet
	if(ClientID != -1 && (ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CClient::STATE_EMPTY || m_aClients[ClientID].m_Quitting))
		return 0;

	mem_zero(&Packet, sizeof(CNetChunk));
	Packet.m_ClientID = ClientID;
	Packet.m_pData = pMsg->Data();
	Packet.m_DataSize = pMsg->Size();

	if(Flags&MSGFLAG_VITAL)
		Packet.m_Flags |= NETSENDFLAG_VITAL;
	if(Flags&MSGFLAG_FLUSH)
		Packet.m_Flags |= NETSENDFLAG_FLUSH;

	// write message to demo recorder
	if(!(Flags&MSGFLAG_NORECORD))
		m_DemoRecorder.RecordMessage(pMsg->Data(), pMsg->Size());

	if(!(Flags&MSGFLAG_NOSEND))
	{
		if(ClientID == -1)
		{
			// broadcast
			int i;
			for(i = 0; i < MAX_CLIENTS; i++)
				if(m_aClients[i].m_State == CClient::STATE_INGAME && !m_aClients[i].m_Quitting)
				{
					Packet.m_ClientID = i;
					m_NetServer.Send(&Packet);
				}
		}
		else
			m_NetServer.Send(&Packet);
	}
	return 0;
}